

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator * __thiscall
QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator++(const_iterator *this)

{
  Chain *pCVar1;
  MultiNode<QString,_QCss::StyleRule> *pMVar2;
  Chain **ppCVar3;
  
  pCVar1 = *this->e;
  this->e = &pCVar1->next;
  if (pCVar1->next == (MultiNodeChain<QCss::StyleRule> *)0x0) {
    QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::operator++(&this->i)
    ;
    if ((this->i).d == (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
      ppCVar3 = (Chain **)0x0;
    }
    else {
      pMVar2 = QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::node
                         (&this->i);
      ppCVar3 = &pMVar2->value;
    }
    this->e = ppCVar3;
  }
  return this;
}

Assistant:

inline const_iterator &operator++() noexcept {
            Q_ASSERT(e && *e);
            e = &(*e)->next;
            Q_ASSERT(e);
            if (!*e) {
                ++i;
                e = i.atEnd() ? nullptr : &i.node()->value;
            }
            return *this;
        }